

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_usage.c
# Opt level: O0

HT_MemoryUsageContext * ht_memory_usage_context_create(void *process_id)

{
  undefined4 local_24;
  HT_MemoryUsageContext *context;
  void *process_id_local;
  
  process_id_local = ht_alloc(4);
  if ((__pid_t *)process_id_local == (__pid_t *)0x0) {
    process_id_local = (void *)0x0;
  }
  else {
    if (process_id == (void *)0x0) {
      local_24 = getpid();
    }
    else {
      local_24 = *process_id;
    }
    *(__pid_t *)process_id_local = local_24;
  }
  return (HT_MemoryUsageContext *)process_id_local;
}

Assistant:

HT_MemoryUsageContext*
ht_memory_usage_context_create(void* process_id)
{
    HT_MemoryUsageContext* context = HT_CREATE_TYPE(HT_MemoryUsageContext);

    if (context == NULL)
    {
        return NULL;
    }

    context->pid = process_id == NULL ? getpid() : *(int*)process_id;
    return context;
}